

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O3

BaseExc * __thiscall Iex_3_2::BaseExc::append(BaseExc *this,stringstream *s)

{
  long *local_38;
  long local_28 [2];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->_message,(ulong)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this;
}

Assistant:

BaseExc&
BaseExc::append (std::stringstream& s)
{
    _message.append (s.str ());
    return *this;
}